

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O0

void test_archive_read_next_header_empty(void)

{
  FILE *pFVar1;
  size_t v2;
  FILE *f;
  
  pFVar1 = fopen("emptyfile","wb");
  fclose(pFVar1);
  pFVar1 = fopen("empty.tar","wb");
  v2 = fwrite(nulls,1,0x200,pFVar1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'u',0x200,"512",v2,"fwrite(nulls, 1, 512, f)",(void *)0x0);
  fclose(pFVar1);
  test_empty_file1();
  test_empty_file2();
  test_empty_tarfile();
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_next_header_empty)
{
	FILE *f;

	/* Create an empty file. */
	f = fopen("emptyfile", "wb");
	fclose(f);

	/* Create a file with 512 zero bytes. */
	f = fopen("empty.tar", "wb");
	assertEqualInt(512, fwrite(nulls, 1, 512, f));
	fclose(f);

	test_empty_file1();
	test_empty_file2();
	test_empty_tarfile();

}